

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

void __thiscall
Js::JSONStringifier::ReadData(JSONStringifier *this,RecyclableObject *valueObj,JSONProperty *prop)

{
  Type TVar1;
  uint uVar2;
  code *pcVar3;
  double value;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  undefined4 *puVar8;
  JavascriptTypedNumber<unsigned_long> *pJVar9;
  JavascriptString *pJVar10;
  JavascriptBoolean *pJVar11;
  JavascriptTypedNumber<long> *pJVar12;
  
  if (valueObj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00b76aa0;
    *puVar8 = 0;
  }
  TVar1 = ((valueObj->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(valueObj), BVar5 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar4) goto LAB_00b76aa0;
    *puVar8 = 0;
  }
  switch(TVar1) {
  case TypeIds_Null:
    prop->type = Null;
    break;
  case TypeIds_Boolean:
    pJVar11 = UnsafeVarTo<Js::JavascriptBoolean,Js::RecyclableObject>(valueObj);
    if (pJVar11->value == 0) {
      prop->type = False;
      if (0xfffffffa < this->totalStringLength) goto LAB_00b76aa2;
      cVar7 = this->totalStringLength + 5;
      goto LAB_00b76a4f;
    }
    prop->type = True;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                ,0x305,"((0))","UNREACHED");
    if (!bVar4) {
LAB_00b76aa0:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  case TypeIds_Undefined:
  case TypeIds_Symbol:
    prop->type = Undefined;
    return;
  case TypeIds_Int64Number:
    pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<long>,Js::RecyclableObject>(valueObj);
    value = (double)pJVar12->m_value;
    goto LAB_00b76a73;
  case TypeIds_LastNumberType:
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>,Js::RecyclableObject>(valueObj);
    value = ((double)CONCAT44(0x43300000,(int)pJVar9->m_value) - 4503599627370496.0) +
            ((double)CONCAT44(0x45300000,(int)(pJVar9->m_value >> 0x20)) - 1.9342813113834067e+25);
LAB_00b76a73:
    SetNumericProperty(this,value,valueObj,prop);
    return;
  case TypeIds_String:
    pJVar10 = UnsafeVarTo<Js::JavascriptString,Js::RecyclableObject>(valueObj);
    Memory::Recycler::WBSetBit((char *)&(prop->field_1).obj);
    (prop->field_1).numericValue.value.ptr = pJVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&prop->field_1);
    prop->type = String;
    uVar2 = this->totalStringLength;
    cVar6 = CalculateStringElementLength((JavascriptString *)(prop->field_1).numericValue.value.ptr)
    ;
    cVar7 = cVar6 + uVar2;
    if (!CARRY4(cVar6,uVar2)) goto LAB_00b76a4f;
    goto LAB_00b76aa2;
  }
  if (this->totalStringLength < 0xfffffffc) {
    cVar7 = this->totalStringLength + 4;
LAB_00b76a4f:
    this->totalStringLength = cVar7;
    return;
  }
LAB_00b76aa2:
  ::Math::DefaultOverflowPolicy();
}

Assistant:

void
JSONStringifier::ReadData(_In_ RecyclableObject* valueObj, _Out_ JSONProperty* prop)
{
    TypeId typeId = JavascriptOperators::GetTypeId(valueObj);

    switch (typeId)
    {
    case TypeIds_Null:
        this->SetNullProperty(prop);
        return;

    case TypeIds_Boolean:
        if (UnsafeVarTo<JavascriptBoolean>(valueObj)->GetValue() != FALSE)
        {
            prop->type = JSONContentType::True;
            this->totalStringLength = UInt32Math::Add(this->totalStringLength, Constants::TrueStringLength);
        }
        else
        {
            prop->type = JSONContentType::False;
            this->totalStringLength = UInt32Math::Add(this->totalStringLength, Constants::FalseStringLength);
        }
        return;

    case TypeIds_Int64Number:
        this->SetNumericProperty(static_cast<double>(UnsafeVarTo<JavascriptInt64Number>(valueObj)->GetValue()), valueObj, prop);
        return;

    case TypeIds_UInt64Number:
        this->SetNumericProperty(static_cast<double>(UnsafeVarTo<JavascriptUInt64Number>(valueObj)->GetValue()), valueObj, prop);
        return;

#if !FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(valueObj), valueObj, prop);
        return;
#endif

    case TypeIds_String:
        prop->stringValue = UnsafeVarTo<JavascriptString>(valueObj);
        prop->type = JSONContentType::String;
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, CalculateStringElementLength(prop->stringValue));
        return;

    case TypeIds_Symbol:
        // Treat symbols as undefined
    case TypeIds_Undefined:
        // If undefined is in an object, it is not included in the string, and if it is an array element it will show up as "null"
        // Given that, we can't caluclate the string length here and instead we do it at the usage points
        prop->type = JSONContentType::Undefined;
        return;

    default:
        Assert(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}